

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_PopMatrix(void)

{
  GPU_Target *pGVar1;
  GPU_MatrixStack *local_20;
  GPU_MatrixStack *stack;
  GPU_Target *target;
  
  pGVar1 = GPU_GetContextTarget();
  if ((pGVar1 != (GPU_Target *)0x0) && (pGVar1->context != (GPU_Context *)0x0)) {
    GPU_FlushBlitBuffer();
    if (pGVar1->context->matrix_mode == 0) {
      local_20 = &pGVar1->context->modelview_matrix;
    }
    else {
      local_20 = &pGVar1->context->projection_matrix;
    }
    if (local_20->size == 0) {
      GPU_PushErrorCode("GPU_PopMatrix",GPU_ERROR_USER_ERROR,"Matrix stack is empty.");
    }
    else if (local_20->size == 1) {
      GPU_PushErrorCode("GPU_PopMatrix",GPU_ERROR_USER_ERROR,"Matrix stack would become empty!");
    }
    else {
      local_20->size = local_20->size - 1;
    }
  }
  return;
}

Assistant:

void GPU_PopMatrix(void)
{
    GPU_Target* target = GPU_GetContextTarget();
	GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return;
        
	GPU_FlushBlitBuffer();
    stack = (target->context->matrix_mode == GPU_MODELVIEW? &target->context->modelview_matrix : &target->context->projection_matrix);
    if(stack->size == 0)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Matrix stack is empty.");
    }
    else if(stack->size == 1)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Matrix stack would become empty!");
    }
    else
        stack->size--;
}